

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsay.c
# Opt level: O0

void speak_stdin_console(OpenJTalk *openjtalk)

{
  char *pcVar1;
  size_t sVar2;
  undefined8 in_RDI;
  int empty;
  char line [1001];
  int local_3fc;
  char local_3f8 [1008];
  undefined8 local_8;
  
  local_3fc = 0;
  local_8 = in_RDI;
  do {
    while( true ) {
      pcVar1 = fgets(local_3f8,0x104,_stdin);
      if (pcVar1 == (char *)0x0) {
        return;
      }
      remove_cr_lf(local_3f8);
      sVar2 = strlen(local_3f8);
      if (sVar2 == 0) break;
      openjtalk_speakSync(local_8,local_3f8);
    }
    local_3fc = local_3fc + 1;
  } while (local_3fc != 2);
  return;
}

Assistant:

void speak_stdin_console(OpenJTalk *openjtalk)
{
	char line[MAX_LENGTH + 1];
	int empty = 0;

	while (fgets(line, MAX_PATH, stdin) != NULL)
	{
		remove_cr_lf(line);
		if (strlen(line) == 0)
		{
			empty++;
			if (empty == 2)
			{
				break;
			}
			continue;
		}
#if defined(_WIN32)
		openjtalk_speakSyncSjis(openjtalk, line);
#else
		openjtalk_speakSync(openjtalk, line);
#endif
	}
}